

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Functions.cpp
# Opt level: O1

string_view translateCharacter(string_view object)

{
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  size_type sVar4;
  char *pcVar5;
  char *in_RSI;
  size_t in_RDI;
  char *pcVar6;
  size_type __rlen;
  string_view sVar7;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  local_30._M_len = in_RDI;
  local_30._M_str = in_RSI;
  sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_30,"GDI_",0,4);
  sVar2 = local_30._M_len;
  if (sVar4 == 0) {
    pcVar6 = local_30._M_str + 4;
    sVar1 = local_30._M_len - 4;
    local_30._M_len = sVar1;
    local_30._M_str = pcVar6;
    if (sVar1 == 7) {
      iVar3 = bcmp(pcVar6,"Deadeye",7);
      pcVar5 = "Deadeye";
      if (iVar3 != 0) goto LAB_00121f4f;
LAB_00122353:
      local_30._M_str = pcVar5;
      local_30._M_len = 7;
      goto LAB_00122445;
    }
LAB_00121f4f:
    if ((sVar1 == 8) && (iVar3 = bcmp(pcVar6,"Engineer",8), iVar3 == 0)) {
      local_30._M_str = "GDI Engineer";
      goto LAB_001223cb;
    }
    if (sVar1 == 9) {
      iVar3 = bcmp(pcVar6,"Grenadier",9);
      pcVar5 = "Grenadier";
      if (iVar3 != 0) goto LAB_00121f92;
LAB_00122367:
      local_30._M_str = pcVar5;
      local_30._M_len = 9;
      goto LAB_00122445;
    }
LAB_00121f92:
    if (sVar1 == 6) {
      pcVar5 = "Gunner";
      iVar3 = bcmp(pcVar6,"Gunner",6);
      if (iVar3 != 0) goto LAB_00121fb5;
    }
    else {
LAB_00121fb5:
      if (sVar1 == 5) {
        iVar3 = bcmp(pcVar6,"Havoc",5);
        pcVar5 = "Havoc";
        if (iVar3 != 0) goto LAB_00121fd8;
LAB_0012238b:
        local_30._M_str = pcVar5;
        local_30._M_len = 5;
        goto LAB_00122445;
      }
LAB_00121fd8:
      if (sVar1 == 7) {
        iVar3 = bcmp(pcVar6,"Hotwire",7);
        pcVar5 = "Hotwire";
        if (iVar3 == 0) goto LAB_00122353;
      }
      if ((sVar1 == 8) && (iVar3 = bcmp(pcVar6,"Marksman",8), iVar3 == 0)) {
        local_30._M_str = "GDI Marksman";
        goto LAB_001223cb;
      }
      if (sVar1 == 9) {
        iVar3 = bcmp(pcVar6,"McFarland",9);
        pcVar5 = "McFarland";
        if (iVar3 == 0) goto LAB_00122367;
      }
      if (sVar1 == 6) {
        pcVar5 = "Mobius";
        iVar3 = bcmp(pcVar6,"Mobius",6);
        if (iVar3 == 0) goto LAB_0012235d;
      }
      if ((sVar1 == 7) && (iVar3 = bcmp(pcVar6,"Officer",7), iVar3 == 0)) {
        local_30._M_str = "GDI Officer";
        goto LAB_00122432;
      }
      if (sVar1 == 5) {
        iVar3 = bcmp(pcVar6,"Patch",5);
        pcVar5 = "Patch";
        if (iVar3 == 0) goto LAB_0012238b;
      }
      if (sVar2 == 0xe) {
LAB_001220d0:
        iVar3 = bcmp(pcVar6,"Shotgunner",sVar1);
        if (iVar3 == 0) {
          local_30._M_str = "GDI Shotgunner";
          goto LAB_00122400;
        }
      }
      else if (sVar2 == 0x11) {
        iVar3 = bcmp(pcVar6,"RocketSoldier",sVar1);
        if (iVar3 == 0) {
          local_30._M_str = "GDI Rocket Soldier";
          goto LAB_00122440;
        }
        if (sVar1 == 10) goto LAB_001220d0;
      }
      if ((sVar1 == 7) && (iVar3 = bcmp(pcVar6,"Soldier",7), iVar3 == 0)) {
        local_30._M_str = "GDI Soldier";
        goto LAB_00122432;
      }
      if (sVar1 != 6) goto LAB_00122445;
      pcVar5 = "Sydney";
      iVar3 = bcmp(pcVar6,"Sydney",6);
      if (iVar3 != 0) goto LAB_00122445;
    }
LAB_0012235d:
    local_30._M_len = 6;
    local_30._M_str = pcVar5;
  }
  else {
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_30,"Nod_",0,4);
    sVar2 = local_30._M_len;
    if (sVar4 != 0) goto LAB_00122445;
    pcVar6 = local_30._M_str + 4;
    sVar1 = local_30._M_len - 4;
    local_30._M_len = sVar1;
    local_30._M_str = pcVar6;
    if (sVar1 == 0xf) {
      iVar3 = bcmp(pcVar6,"BlackHandSniper",0xf);
      if (iVar3 == 0) {
        local_30._M_str = "Black Hand Sniper";
        local_30._M_len = 0x11;
        goto LAB_00122445;
      }
      iVar3 = bcmp(pcVar6,"ChemicalTrooper",0xf);
      if (iVar3 == 0) {
        local_30._M_str = "Chemical Trooper";
        local_30._M_len = 0x10;
        goto LAB_00122445;
      }
    }
    if ((sVar1 == 8) && (iVar3 = bcmp(pcVar6,"Engineer",8), iVar3 == 0)) {
      local_30._M_str = "Nod Engineer";
LAB_001223cb:
      local_30._M_len = 0xc;
      goto LAB_00122445;
    }
    if ((sVar1 == 0xc) && (iVar3 = bcmp(pcVar6,"FlameTrooper",0xc), iVar3 == 0)) {
      local_30._M_str = "Flame Trooper";
      local_30._M_len = 0xd;
      goto LAB_00122445;
    }
    if ((sVar1 == 0x10) && (iVar3 = bcmp(pcVar6,"LaserChainGunner",0x10), iVar3 == 0)) {
      local_30._M_str = "Laser Chain Gunner";
LAB_00122440:
      local_30._M_len = 0x12;
      goto LAB_00122445;
    }
    if ((sVar1 == 8) && (iVar3 = bcmp(pcVar6,"Marksman",8), iVar3 == 0)) {
      local_30._M_str = "Nod Marksman";
      goto LAB_001223cb;
    }
    if (sVar1 != 7) {
LAB_00122256:
      if (sVar1 == 8) {
        iVar3 = bcmp(pcVar6,"Raveshaw",8);
        if (iVar3 == 0) {
          local_30._M_len = 8;
          local_30._M_str = "Raveshaw";
          goto LAB_00122445;
        }
      }
      if (sVar2 == 10) {
LAB_001222a5:
        pcVar5 = "Sakura";
        iVar3 = bcmp(pcVar6,"Sakura",sVar1);
        if (iVar3 != 0) goto LAB_001222c2;
        goto LAB_0012235d;
      }
      if (sVar2 == 0x11) {
        iVar3 = bcmp(pcVar6,"RocketSoldier",sVar1);
        if (iVar3 == 0) {
          local_30._M_str = "Nod Rocket Soldier";
          goto LAB_00122440;
        }
        if (sVar1 == 6) goto LAB_001222a5;
      }
LAB_001222c2:
      if ((sVar1 != 10) || (iVar3 = bcmp(pcVar6,"Shotgunner",10), iVar3 != 0)) {
        if ((sVar1 != 7) || (iVar3 = bcmp(pcVar6,"Soldier",7), iVar3 != 0)) {
          if ((sVar1 != 0x10) || (iVar3 = bcmp(pcVar6,"StealthBlackHand",0x10), iVar3 != 0)) {
            if (sVar1 == 10) {
              iVar3 = bcmp(pcVar6,"Technician",10);
              if (iVar3 == 0) {
                local_30._M_len = 10;
                local_30._M_str = "Technician";
              }
            }
            goto LAB_00122445;
          }
          local_30._M_str = "Stealth Black Hand";
          goto LAB_00122440;
        }
        local_30._M_str = "Nod Soldier";
        goto LAB_00122432;
      }
      local_30._M_str = "Nod Shotgunner";
LAB_00122400:
      local_30._M_len = 0xe;
      goto LAB_00122445;
    }
    iVar3 = bcmp(pcVar6,"Mendoza",7);
    pcVar5 = "Mendoza";
    if (iVar3 == 0) goto LAB_00122353;
    iVar3 = bcmp(pcVar6,"Officer",7);
    if (iVar3 != 0) goto LAB_00122256;
    local_30._M_str = "Nod Officer";
LAB_00122432:
    local_30._M_len = 0xb;
  }
LAB_00122445:
  sVar7._M_str = local_30._M_str;
  sVar7._M_len = local_30._M_len;
  return sVar7;
}

Assistant:

std::string_view translateCharacter(std::string_view object)
{
	if (object.find("GDI_"sv) == 0)
	{
		object.remove_prefix(4);
		if (object == "Deadeye"sv) return translated_GDI_Deadeye;
		if (object == "Engineer"sv) return translated_GDI_Engineer;
		if (object == "Grenadier"sv) return translated_GDI_Grenadier;
		if (object == "Gunner"sv) return translated_GDI_Gunner;
		if (object == "Havoc"sv) return translated_GDI_Havoc;
		if (object == "Hotwire"sv) return translated_GDI_Hotwire;
		if (object == "Marksman"sv) return translated_GDI_Marksman;
		if (object == "McFarland"sv) return translated_GDI_McFarland;
		if (object == "Mobius"sv) return translated_GDI_Mobius;
		if (object == "Officer"sv) return translated_GDI_Officer;
		if (object == "Patch"sv) return translated_GDI_Patch;
		if (object == "RocketSoldier"sv) return translated_GDI_RocketSoldier;
		if (object == "Shotgunner"sv) return translated_GDI_Shotgunner;
		if (object == "Soldier"sv) return translated_GDI_Soldier;
		if (object == "Sydney"sv) return translated_GDI_Sydney;
	}
	else if (object.find("Nod_"sv) == 0)
	{
		object.remove_prefix(4);
		if (object == "BlackHandSniper"sv) return translated_Nod_BlackHandSniper;
		if (object == "ChemicalTrooper"sv) return translated_Nod_ChemicalTrooper;
		if (object == "Engineer"sv) return translated_Nod_Engineer;
		if (object == "FlameTrooper"sv) return translated_Nod_FlameTrooper;
		if (object == "LaserChainGunner"sv) return translated_Nod_LaserChainGunner;
		if (object == "Marksman"sv) return translated_Nod_Marksman;
		if (object == "Mendoza"sv) return translated_Nod_Mendoza;
		if (object == "Officer"sv) return translated_Nod_Officer;
		if (object == "Raveshaw"sv) return translated_Nod_Raveshaw;
		if (object == "RocketSoldier"sv) return translated_Nod_RocketSoldier;
		if (object == "Sakura"sv) return translated_Nod_Sakura;
		if (object == "Shotgunner"sv) return translated_Nod_Shotgunner;
		if (object == "Soldier"sv) return translated_Nod_Soldier;
		if (object == "StealthBlackHand"sv) return translated_Nod_StealthBlackHand;
		if (object == "Technician"sv) return translated_Nod_Technician;
	}

	return object;
}